

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclTimeNodePrint(SC_Man *p,Abc_Obj_t *pObj,int fRise,int Length,float maxDelay)

{
  int iVar1;
  uint uVar2;
  SC_Pin *pSVar3;
  char *pcVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  uint local_6c;
  double local_68;
  double local_60;
  double local_50;
  char *local_48;
  SC_Cell *local_38;
  SC_Cell *pCell;
  float maxDelay_local;
  int Length_local;
  int fRise_local;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  iVar1 = Abc_ObjIsNode(pObj);
  if (iVar1 == 0) {
    local_38 = (SC_Cell *)0x0;
  }
  else {
    local_38 = Abc_SclObjCell(pObj);
  }
  uVar2 = Abc_ObjId(pObj);
  printf("%8d : ",(ulong)uVar2);
  uVar2 = Abc_ObjFaninNum(pObj);
  printf("%d ",(ulong)uVar2);
  uVar2 = Abc_ObjFanoutNum(pObj);
  printf("%4d ",(ulong)uVar2);
  if (local_38 == (SC_Cell *)0x0) {
    local_48 = "pi";
  }
  else {
    local_48 = local_38->pName;
  }
  printf("%-*s ",(ulong)(uint)Length,local_48);
  if (local_38 == (SC_Cell *)0x0) {
    local_50 = 0.0;
  }
  else {
    local_50 = (double)local_38->area;
  }
  printf("A =%7.2f  ",local_50);
  pcVar4 = "f";
  if (fRise != 0) {
    pcVar4 = "r";
  }
  printf("D%s =",pcVar4);
  fVar5 = Abc_SclObjTimeMax(p,pObj);
  printf("%6.1f",(double)fVar5);
  dVar7 = Abc_SclObjTimeOne(p,pObj,0);
  dVar8 = Abc_SclObjTimeOne(p,pObj,1);
  fVar5 = Abc_AbsFloat((float)(dVar7 - dVar8));
  printf("%7.1f ps  ",(double)-fVar5);
  Abc_SclObjSlewMax(p,pObj);
  printf("S =%6.1f ps  ");
  if (local_38 == (SC_Cell *)0x0) {
    local_60 = 0.0;
  }
  else {
    fVar5 = SC_CellPinCapAve(local_38);
    local_60 = (double)fVar5;
  }
  printf("Cin =%5.1f ff  ",local_60);
  Abc_SclObjLoadMax(p,pObj);
  printf("Cout =%6.1f ff  ");
  if (local_38 == (SC_Cell *)0x0) {
    local_68 = 0.0;
  }
  else {
    pSVar3 = SC_CellPin(local_38,local_38->n_inputs);
    local_68 = (double)pSVar3->max_out_cap;
  }
  printf("Cmax =%6.1f ff  ",local_68);
  if (local_38 == (SC_Cell *)0x0) {
    local_6c = 0;
  }
  else {
    fVar5 = Abc_SclObjLoadAve(p,pObj);
    fVar6 = SC_CellPinCapAve(local_38);
    local_6c = (uint)((fVar5 * 100.0) / fVar6);
  }
  printf("G =%5d  ",(ulong)local_6c);
  printf("\n");
  return;
}

Assistant:

static inline void Abc_SclTimeNodePrint( SC_Man * p, Abc_Obj_t * pObj, int fRise, int Length, float maxDelay )
{
    SC_Cell * pCell = Abc_ObjIsNode(pObj) ? Abc_SclObjCell(pObj) : NULL;
    printf( "%8d : ",           Abc_ObjId(pObj) );
    printf( "%d ",              Abc_ObjFaninNum(pObj) );
    printf( "%4d ",             Abc_ObjFanoutNum(pObj) );
    printf( "%-*s ",            Length, pCell ? pCell->pName : "pi" );
    printf( "A =%7.2f  ",       pCell ? pCell->area : 0.0 );
    printf( "D%s =",            fRise ? "r" : "f" );
    printf( "%6.1f",            Abc_SclObjTimeMax(p, pObj) );
    printf( "%7.1f ps  ",       -Abc_AbsFloat(Abc_SclObjTimeOne(p, pObj, 0) - Abc_SclObjTimeOne(p, pObj, 1)) );
    printf( "S =%6.1f ps  ",    Abc_SclObjSlewMax(p, pObj) );
    printf( "Cin =%5.1f ff  ",  pCell ? SC_CellPinCapAve(pCell) : 0.0 );
    printf( "Cout =%6.1f ff  ", Abc_SclObjLoadMax(p, pObj) );
    printf( "Cmax =%6.1f ff  ", pCell ? SC_CellPin(pCell, pCell->n_inputs)->max_out_cap : 0.0 );
    printf( "G =%5d  ",         pCell ? (int)(100.0 * Abc_SclObjLoadAve(p, pObj) / SC_CellPinCapAve(pCell)) : 0 );
//    printf( "SL =%6.1f ps",     Abc_SclObjSlackMax(p, pObj, p->MaxDelay0) );
    printf( "\n" );
}